

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int path_from_string_n(char *str,size_t str_len,uint32_t child_num,uint32_t flags,
                      uint32_t *child_path,uint32_t child_path_len,size_t *written)

{
  char cVar1;
  uint64_t uVar2;
  _Bool _Var3;
  bool bVar4;
  bool bVar5;
  uint uStack_50;
  _Bool is_wildcard;
  uint64_t v;
  size_t i;
  size_t start;
  uint32_t *puStack_30;
  uint32_t child_path_len_local;
  uint32_t *child_path_local;
  uint32_t flags_local;
  uint32_t child_num_local;
  size_t str_len_local;
  char *str_local;
  
  v = 0;
  if ((((str == (char *)0x0) || (str_len == 0)) || (0x7fffffff < child_num)) ||
     (written == (size_t *)0x0)) {
LAB_00148f48:
    if (written != (size_t *)0x0) {
      *written = 0;
    }
    return -2;
  }
  *written = 0;
  puStack_30 = child_path;
  child_path_local._0_4_ = flags;
  if ((flags & 0x10) == 0) {
    if ((str_len != 0) && ((*str == 'm' || (*str == 'M')))) {
      v = 1;
    }
    if ((v < str_len) && (str[v] == '/')) {
      v = v + 1;
    }
  }
  else if (str_len != 0) {
    cVar1 = *str;
    goto joined_r0x00148c5c;
  }
  do {
    while( true ) {
      uVar2 = v;
      if (str_len <= v) {
        if (*written == 0) {
          return -2;
        }
        return 0;
      }
      bVar5 = false;
      _uStack_50 = 0;
      while( true ) {
        bVar4 = false;
        if (('/' < str[v]) && (bVar4 = false, str[v] < ':')) {
          bVar4 = v < str_len;
        }
        if (!bVar4) break;
        _uStack_50 = _uStack_50 * 10 + (long)(str[v] + -0x30);
        if (0x7fffffff < _uStack_50) goto LAB_00148f48;
        v = v + 1;
      }
      if (v == uVar2) break;
LAB_00148e91:
      _Var3 = is_hardened_indicator(str[v]);
      if (_Var3) {
        uStack_50 = uStack_50 | 0x80000000;
        v = v + 1;
      }
      if (((bVar5) && (v != str_len)) && (str[v] != '/')) goto LAB_00148f48;
      if (*written == (ulong)child_path_len) {
        puStack_30 = (uint32_t *)0x0;
      }
      if (puStack_30 != (uint32_t *)0x0) {
        puStack_30[*written] = uStack_50;
      }
      *written = *written + 1;
    }
    if (str[v] != '/') {
      bVar5 = str[v] == '*';
      if (((bVar5) && (((uint32_t)child_path_local & 8) != 0)) &&
         ((child_path_local._0_4_ = 0, v == 0 || (str[v - 1] == '/')))) {
        v = v + 1;
        _uStack_50 = (ulong)child_num;
        goto LAB_00148e91;
      }
      goto LAB_00148f48;
    }
    if (((v != 0) &&
        ((((str[v - 1] < '0' || ('9' < str[v - 1])) &&
          (_Var3 = is_hardened_indicator(str[v - 1]), !_Var3)) && (str[v - 1] != '*')))) ||
       (v = v + 1, v == str_len)) goto LAB_00148f48;
    cVar1 = str[v];
joined_r0x00148c5c:
    if (cVar1 == '/') goto LAB_00148f48;
  } while( true );
}

Assistant:

static int path_from_string_n(const char *str, size_t str_len,
                              uint32_t child_num, uint32_t flags,
                              uint32_t *child_path, uint32_t child_path_len,
                              size_t *written)
{
    size_t start, i = 0;
    uint64_t v;

    if (!str || !str_len || child_num >= BIP32_INITIAL_HARDENED_CHILD || !written)
        goto fail;

    *written = 0;

    if (flags & BIP32_FLAG_STR_BARE) {
        if (i < str_len && str[i] == '/')
            goto fail; /* bare path must start with a number */
    } else {
        if (i < str_len && (str[i] == 'm' || str[i] == 'M'))
            ++i; /* Skip */
        if (i < str_len && str[i] == '/')
            ++i; /* Skip */
    }

    while (i < str_len) {
        bool is_wildcard = false;
        start = i;
        v = 0;
        while (str[i] >= '0' && str[i] <= '9' && i < str_len) {
            v = v * 10 + (str[i] - '0');
            if (v >= BIP32_INITIAL_HARDENED_CHILD)
                goto fail; /* Derivation index too large */
            ++i;
        }
        if (i == start) {
            /* No number found */
            if (str[i] == '/') {
                if (i && (str[i - 1] < '0' || str[i - 1] > '9') &&
                    !is_hardened_indicator(str[i - 1]) && str[i - 1] != '*')
                    goto fail; /* Only valid after number/wildcard/hardened indicator */
                ++i;
                if (i == str_len || str[i] == '/')
                    goto fail; /* Trailing slash, invalid */
                continue;
            }
            if (!(is_wildcard = str[i] == '*'))
                goto fail; /* Unknown character */

            /* Wildcard */
            if (!(flags & BIP32_FLAG_STR_WILDCARD))
                goto fail; /* Wildcard not allowed, or previously seen */
            flags &= ~BIP32_FLAG_STR_WILDCARD;
            if (i && str[i - 1] != '/')
                goto fail; /* Must follow a slash */
            ++i;
            v = child_num; /* Use the given child number for the wildcard value */
        }

        if (is_hardened_indicator(str[i])) {
            v |= BIP32_INITIAL_HARDENED_CHILD;
            ++i;
        }
        if (is_wildcard && i != str_len && str[i] != '/')
            goto fail; /* Wildcard followed by something other than a slash */
        if (*written == child_path_len) {
            /* Continue counting the resulting length, but don't write any more */
            child_path = NULL;
        }
        if (child_path)
            child_path[*written] = v;
        ++*written;
    }

    return *written ? WALLY_OK : WALLY_EINVAL;
fail:
    if (written)
        *written = 0;
    return WALLY_EINVAL;
}